

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmInstruction * UnderlyingValue(VmInstruction *inst)

{
  VmValue *pVVar1;
  VmValue **ppVVar2;
  uint index;
  VmInstruction *pVVar3;
  VmValueType index_00;
  VmInstruction *pVVar4;
  
LAB_00195f87:
  while (pVVar3 = inst, pVVar3->cmd == VM_INST_MOV) {
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,0);
    inst = (VmInstruction *)*ppVVar2;
    if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
      __assert_fail("argument",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1d05,"VmInstruction *UnderlyingValue(VmInstruction *)");
    }
  }
  if (pVVar3->cmd == VM_INST_DEF) {
    for (index = 0; index < (pVVar3->super_VmValue).users.count; index = index + 1) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar3->super_VmValue).users,index);
      pVVar1 = *ppVVar2;
      if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
         (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) {
        index_00 = VM_TYPE_VOID;
        while (index_00 < pVVar1[1].type.type) {
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index_00);
          pVVar4 = (VmInstruction *)*ppVVar2;
          if ((pVVar4 == (VmInstruction *)0x0) || ((pVVar4->super_VmValue).typeID != 2)) {
            pVVar4 = (VmInstruction *)0x0;
          }
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index_00 + VM_TYPE_INT
                              );
          inst = (VmInstruction *)*ppVVar2;
          if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
            if (pVVar4 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1d18,"VmInstruction *UnderlyingValue(VmInstruction *)");
            }
LAB_00196097:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1d17,"VmInstruction *UnderlyingValue(VmInstruction *)");
          }
          if (pVVar4 == (VmInstruction *)0x0) goto LAB_00196097;
          index_00 = index_00 + VM_TYPE_DOUBLE;
          if (pVVar4 == pVVar3) goto LAB_00195f87;
        }
      }
    }
  }
  return pVVar3;
}

Assistant:

VmInstruction* UnderlyingValue(VmInstruction *inst)
{
	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *argument = getType<VmInstruction>(inst->arguments[0]);

		assert(argument);

		return UnderlyingValue(argument);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						return UnderlyingValue(source);
				}
			}
		}
	}

	return inst;
}